

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS ref_shard_create(REF_SHARD *ref_shard_ptr,REF_GRID ref_grid)

{
  uint uVar1;
  REF_SHARD pRVar2;
  REF_INT *pRVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 uStack_20;
  
  pRVar2 = (REF_SHARD)malloc(0x18);
  *ref_shard_ptr = pRVar2;
  if (pRVar2 == (REF_SHARD)0x0) {
    pcVar5 = "malloc *ref_shard_ptr of REF_SHARD_STRUCT NULL";
    uStack_20 = 0x23;
  }
  else {
    pRVar2->grid = ref_grid;
    uVar1 = ref_face_create(&pRVar2->face,ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x2a,
             "ref_shard_create",(ulong)uVar1,"create face");
      return uVar1;
    }
    uVar6 = (ulong)pRVar2->face->n;
    if ((long)uVar6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x2c,
             "ref_shard_create","malloc ref_shard->mark of REF_INT negative");
      return 1;
    }
    pRVar3 = (REF_INT *)malloc(uVar6 * 4);
    pRVar2->mark = pRVar3;
    if (pRVar3 != (REF_INT *)0x0) {
      for (uVar4 = 0; uVar4 < uVar6; uVar4 = uVar4 + 1) {
        pRVar3[uVar4] = 0;
      }
      return 0;
    }
    pcVar5 = "malloc ref_shard->mark of REF_INT NULL";
    uStack_20 = 0x2c;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uStack_20
         ,"ref_shard_create",pcVar5);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_shard_create(REF_SHARD *ref_shard_ptr,
                                    REF_GRID ref_grid) {
  REF_SHARD ref_shard;
  REF_INT face;

  ref_malloc(*ref_shard_ptr, 1, REF_SHARD_STRUCT);

  ref_shard = *ref_shard_ptr;

  ref_shard_grid(ref_shard) = ref_grid;

  RSS(ref_face_create(&(ref_shard_face(ref_shard)), ref_shard_grid(ref_shard)),
      "create face");

  ref_malloc(ref_shard->mark, ref_face_n(ref_shard_face(ref_shard)), REF_INT);

  for (face = 0; face < ref_face_n(ref_shard_face(ref_shard)); face++)
    ref_shard_mark(ref_shard, face) = 0;

  return REF_SUCCESS;
}